

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

void __thiscall Json::OurCharReader::OurImpl::~OurImpl(OurImpl *this)

{
  OurImpl *this_local;
  
  ~OurImpl(this);
  operator_delete(this,0x140);
  return;
}

Assistant:

OurImpl(bool collectComments, OurFeatures const& features)
        : collectComments_(collectComments), reader_(features) {}